

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O0

void Fxu_ListDoubleDelPair(Fxu_Double *pDiv,Fxu_Pair *pLink)

{
  Fxu_ListPair *pList;
  Fxu_Pair *pLink_local;
  Fxu_Double *pDiv_local;
  
  if ((pDiv->lPairs).pHead == pLink) {
    (pDiv->lPairs).pHead = pLink->pDNext;
  }
  if ((pDiv->lPairs).pTail == pLink) {
    (pDiv->lPairs).pTail = pLink->pDPrev;
  }
  if (pLink->pDPrev != (Fxu_Pair *)0x0) {
    pLink->pDPrev->pDNext = pLink->pDNext;
  }
  if (pLink->pDNext != (Fxu_Pair *)0x0) {
    pLink->pDNext->pDPrev = pLink->pDPrev;
  }
  (pDiv->lPairs).nItems = (pDiv->lPairs).nItems + -1;
  return;
}

Assistant:

void Fxu_ListDoubleDelPair( Fxu_Double * pDiv, Fxu_Pair * pLink )
{
    Fxu_ListPair * pList = &pDiv->lPairs;
    if ( pList->pHead == pLink )
         pList->pHead = pLink->pDNext;
    if ( pList->pTail == pLink )
         pList->pTail = pLink->pDPrev;
    if ( pLink->pDPrev )
         pLink->pDPrev->pDNext = pLink->pDNext;
    if ( pLink->pDNext )
         pLink->pDNext->pDPrev = pLink->pDPrev;
    pList->nItems--;
}